

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::tetallnormal
          (tetgenmesh *this,point pa,point pb,point pc,point pd,double (*N) [3],double *volume)

{
  bool bVar1;
  long lVar2;
  double (*padVar3) [3];
  double rhs [4];
  double D;
  double A [4] [4];
  int local_f8;
  int local_f4;
  int local_f0;
  double local_e8 [5];
  double local_c0;
  double local_b8 [4];
  double adStack_98 [4];
  double adStack_78 [9];
  
  lVar2 = 0;
  do {
    local_b8[lVar2] = pa[lVar2] - pd[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    local_b8[lVar2 + 4] = pb[lVar2] - pd[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    adStack_78[lVar2] = pc[lVar2] - pd[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  bVar1 = lu_decmp(this,&local_b8,3,&local_f8,&local_c0,0);
  if (bVar1) {
    if (volume != (double *)0x0) {
      *volume = ABS(local_b8[(long)local_f8 * 4] * local_b8[(long)local_f4 * 4 + 1] *
                    local_b8[(long)local_f0 * 4 + 2]) / 6.0;
    }
    lVar2 = 0;
    padVar3 = N;
    do {
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      local_e8[lVar2] = 1.0;
      lu_solve(this,&local_b8,3,&local_f8,local_e8,0);
      (*padVar3)[2] = local_e8[2];
      (*padVar3)[0] = local_e8[0];
      (*padVar3)[1] = local_e8[1];
      lVar2 = lVar2 + 1;
      padVar3 = padVar3 + 1;
    } while (lVar2 != 3);
    lVar2 = -3;
    do {
      N[4][lVar2] = (-N[1][lVar2] - N[2][lVar2]) - N[3][lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0);
  }
  else if (volume != (double *)0x0) {
    *volume = 0.0;
  }
  return;
}

Assistant:

void tetgenmesh::tetallnormal(point pa, point pb, point pc, point pd,
                              REAL N[4][3], REAL* volume)
{
  REAL A[4][4], rhs[4], D;
  int indx[4];
  int i, j;

  // get the entries of A[3][3].
  for (i = 0; i < 3; i++) A[0][i] = pa[i] - pd[i];  // d->a vec
  for (i = 0; i < 3; i++) A[1][i] = pb[i] - pd[i];  // d->b vec
  for (i = 0; i < 3; i++) A[2][i] = pc[i] - pd[i];  // d->c vec

  // Compute the inverse of matrix A, to get 3 normals of the 4 faces.
  if (lu_decmp(A, 3, indx, &D, 0)) { // Decompose the matrix just once.
    if (volume != NULL) {
      // Get the volume of the tet.
      *volume = fabs((A[indx[0]][0] * A[indx[1]][1] * A[indx[2]][2])) / 6.0;
    }
    for (j = 0; j < 3; j++) {
      for (i = 0; i < 3; i++) rhs[i] = 0.0;
      rhs[j] = 1.0;  // Positive means the inside direction
      lu_solve(A, 3, indx, rhs, 0);
      for (i = 0; i < 3; i++) N[j][i] = rhs[i];
    }
    // Get the fourth normal by summing up the first three.
    for (i = 0; i < 3; i++) N[3][i] = - N[0][i] - N[1][i] - N[2][i];
  } else {
    // The tet is degenerated.
    if (volume != NULL) {
      *volume = 0;
    }
  }
}